

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O1

compare_eq_result_container<QList<QModelIndex>,_QModelIndex> __thiscall
QList<QModelIndex>::operator==(QList<QModelIndex> *this,QList<QModelIndex> *other)

{
  long lVar1;
  long lVar2;
  const_iterator __first1;
  const_iterator __first2;
  bool bVar3;
  
  lVar1 = (this->d).size;
  lVar2 = (other->d).size;
  if (lVar1 == lVar2) {
    __first1.i = (this->d).ptr;
    __first2.i = (other->d).ptr;
    if (__first1.i == __first2.i) {
      return true;
    }
    if (lVar1 == lVar2) {
      bVar3 = std::__equal<false>::
              equal<QList<QModelIndex>::const_iterator,QList<QModelIndex>::const_iterator>
                        (__first1,__first1.i + lVar1,__first2);
      return bVar3;
    }
  }
  return false;
}

Assistant:

constexpr qsizetype size() const noexcept
    {
#if __has_cpp_attribute(assume)
        constexpr size_t MaxSize = maxSize();
        [[assume(size_t(d.size) <= MaxSize)]];
#endif
        return d.size;
    }